

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findstr.cpp
# Opt level: O1

bool __thiscall
findstr::writeresult
          (findstr *this,string *origin,char *bufstart,uint64_t offset,char *first,char *last)

{
  undefined8 *puVar1;
  char *fmt;
  guid *g;
  char *local_60;
  string local_58;
  uchar *local_38;
  
  this->matchcount = this->matchcount + 1;
  if (this->count_only != false) {
    return true;
  }
  if (this->list_only == true) {
    fprint<std::__cxx11::string_const&>(_stdout,"%s\n",origin);
    return false;
  }
  if (this->verbose == 0) {
    if (this->nameprinted == false) {
      fprint<std::__cxx11::string_const&>(_stdout,"%s\n\t",origin);
    }
    else {
      fprint<>(_stdout,", ");
    }
    local_58._M_dataplus._M_p = first + (offset - (long)bufstart);
    fprint<long>(_stdout,"%08x",(long *)&local_58);
    this->nameprinted = true;
  }
  else {
    if (this->matchbinary == true) {
      local_60 = first + (offset - (long)bufstart);
      fmt = "%s %08x %-b\n";
    }
    else {
      local_60 = first + (offset - (long)bufstart);
      if (this->pattern_is_guid == true) {
        local_38 = (uchar *)(first + 9);
        stringformat<unsigned_int_const&,unsigned_short_const&,unsigned_short_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&>
                  (&local_58,"%08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x",(uint *)first,
                   (unsigned_short *)(first + 4),(unsigned_short *)(first + 6),(uchar *)(first + 8),
                   local_38,(uchar *)(first + 10),(uchar *)(first + 0xb),(uchar *)(first + 0xc),
                   (uchar *)(first + 0xd),(uchar *)(first + 0xe),(uchar *)(first + 0xf));
        fprint<std::__cxx11::string_const&,long,std::__cxx11::string>
                  (_stdout,"%s %08x %s\n",origin,(long *)&local_60,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        goto LAB_001271db;
      }
      fmt = "%s %08x %+b\n";
    }
    local_58._M_dataplus._M_p = first;
    local_58._M_string_length = (size_type)last;
    fprint<std::__cxx11::string_const&,long,Hex::Hexdumper<unsigned_char>>
              (_stdout,fmt,origin,(long *)&local_60,(Hexdumper<unsigned_char> *)&local_58);
  }
LAB_001271db:
  if (this->firstmatch != true) {
    return (bool)(this->matchstart ^ 1);
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = &PTR__exception_00149cf0;
  __cxa_throw(puVar1,&stopsearch::typeinfo,std::exception::~exception);
}

Assistant:

bool writeresult(const std::string& origin, const char *bufstart, uint64_t offset, const char *first, const char *last)
    {
        matchcount++;
        if (count_only)
            return true;
        if (list_only) {
            print("%s\n", origin);
            return false;
        }
        else if (verbose) {
            if (matchbinary)
                print("%s %08x %-b\n", origin, offset + first - bufstart, Hex::dumper((const uint8_t*)first, last - first));
            else if (pattern_is_guid)
                print("%s %08x %s\n", origin, offset + first - bufstart, guidstring((const uint8_t*)first));
            else // TODO: add option to output the actual string, instead of the current 'ascdump'
                print("%s %08x %+b\n", origin, offset + first - bufstart, Hex::dumper((const uint8_t*)first, last - first));
        }
        else {
            if (!nameprinted) {
                print("%s\n\t", origin);
            }
            else {
                print(", ");
            }
            print("%08x", offset + first - bufstart);
            nameprinted = true;
        }
        if (firstmatch)
            throw stopsearch();
        if (matchstart) {
            return false;
        }
        return true;
    }